

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O0

void __thiscall OpenMD::HBondJumpZ::findHBonds(HBondJumpZ *this,int frame)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  double *pdVar6;
  reference pvVar7;
  reference pvVar8;
  int in_ESI;
  long *in_RDI;
  RealType halfBoxZ_;
  Mat3x3d hmat;
  int zBin;
  int aInd;
  int index;
  int hInd;
  Vector3d pos;
  Vector3d aPos;
  Vector3d hPos;
  Vector3d dPos;
  Atom *hba;
  iterator hbai;
  HBondDonor *hbd;
  iterator hbdi;
  MoleculeIterator mj;
  MoleculeIterator mi;
  Molecule *mol2;
  Molecule *mol1;
  Snapshot *in_stack_fffffffffffffc68;
  Molecule *in_stack_fffffffffffffc70;
  HBondJump *in_stack_fffffffffffffc78;
  HBondDonor *in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  double in_stack_fffffffffffffc98;
  HBondJump *in_stack_fffffffffffffca0;
  Molecule *in_stack_fffffffffffffce8;
  HBondJump *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  Globals *in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  HBondJump *in_stack_fffffffffffffd58;
  RectMatrix<double,_3U,_3U> local_108;
  int local_c0;
  int local_bc;
  value_type local_b8;
  int local_b4;
  Vector<double,_3U> local_b0 [4];
  HBondJump *local_50;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_48;
  HBondDonor *local_40;
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  local_38;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_30;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_28;
  Molecule *local_20;
  Molecule *local_18;
  int local_c;
  
  local_c = in_ESI;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_28);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_30);
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  ::__normal_iterator(&local_38);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_48);
  Vector3<double>::Vector3((Vector3<double> *)0x15a2b7);
  Vector3<double>::Vector3((Vector3<double> *)0x15a2c4);
  Vector3<double>::Vector3((Vector3<double> *)0x15a2d1);
  Vector3<double>::Vector3((Vector3<double> *)0x15a2de);
  Snapshot::getHmat(in_stack_fffffffffffffc68);
  pdVar6 = RectMatrix<double,_3U,_3U>::operator()
                     (&local_108,*(uint *)((long)in_RDI + 0x118c),*(uint *)((long)in_RDI + 0x118c));
  dVar1 = *pdVar6;
  local_18 = SimInfo::beginMolecule
                       ((SimInfo *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                        (MoleculeIterator *)in_stack_fffffffffffffc88);
  while (local_18 != (Molecule *)0x0) {
    local_40 = Molecule::beginHBondDonor
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (iterator *)in_stack_fffffffffffffc88);
    while (local_40 != (HBondDonor *)0x0) {
      local_b4 = StuntDouble::getGlobalIndex(&local_40->donatedHydrogen->super_StuntDouble);
      local_b8 = (**(code **)(*in_RDI + 0xa0))(in_RDI,local_c,local_b4);
      local_40 = Molecule::nextHBondDonor
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                            (iterator *)in_stack_fffffffffffffc88);
    }
    local_18 = SimInfo::nextMolecule
                         ((SimInfo *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (MoleculeIterator *)in_stack_fffffffffffffc88);
  }
  local_18 = SimInfo::beginMolecule
                       ((SimInfo *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                        (MoleculeIterator *)in_stack_fffffffffffffc88);
  while (local_18 != (Molecule *)0x0) {
    local_40 = Molecule::beginHBondDonor
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (iterator *)in_stack_fffffffffffffc88);
    while (local_40 != (HBondDonor *)0x0) {
      local_b4 = StuntDouble::getGlobalIndex(&local_40->donatedHydrogen->super_StuntDouble);
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x1c8),(long)local_c);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)local_b4);
      local_b8 = *pvVar8;
      StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffffc78);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffc70,
                 (Vector3<double> *)in_stack_fffffffffffffc68);
      StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffffc78);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffc70,
                 (Vector3<double> *)in_stack_fffffffffffffc68);
      local_30._M_node = local_28._M_node;
      local_20 = SimInfo::beginMolecule
                           ((SimInfo *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90)
                            ,(MoleculeIterator *)in_stack_fffffffffffffc88);
      while (local_20 != (Molecule *)0x0) {
        in_stack_fffffffffffffd58 =
             (HBondJump *)
             Molecule::beginHBondAcceptor
                       ((Molecule *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                        (iterator *)in_stack_fffffffffffffc88);
        local_50 = in_stack_fffffffffffffd58;
        while (local_50 != (HBondJump *)0x0) {
          StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffffc78);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffc70,
                     (Vector3<double> *)in_stack_fffffffffffffc68);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffc70,
                     (Vector3<double> *)in_stack_fffffffffffffc68);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffc70,
                     (Vector3<double> *)in_stack_fffffffffffffc68);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffc70,
                     (Vector3<double> *)in_stack_fffffffffffffc68);
          bVar4 = HBondJump::isHBond(in_stack_fffffffffffffd58,
                                     (Vector3d *)
                                     CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                                     (Vector3d *)in_stack_fffffffffffffd48,
                                     (Vector3d *)
                                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
          in_stack_fffffffffffffd54 = CONCAT13(bVar4,(int3)in_stack_fffffffffffffd54);
          if (bVar4) {
            in_stack_fffffffffffffd50 = StuntDouble::getGlobalIndex((StuntDouble *)local_50);
            local_bc = in_stack_fffffffffffffd50;
            HBondJump::registerHydrogenBond
                      (in_stack_fffffffffffffca0,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                       SUB84(in_stack_fffffffffffffc98,0),in_stack_fffffffffffffc94,
                       in_stack_fffffffffffffc90);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffffc70,
                       (Vector3<double> *)in_stack_fffffffffffffc68);
            in_stack_fffffffffffffd48 = SimInfo::getSimParams((SimInfo *)in_RDI[0x13]);
            in_stack_fffffffffffffd47 =
                 Globals::getUsePeriodicBoundaryConditions((Globals *)0x15a7dc);
            if ((bool)in_stack_fffffffffffffd47) {
              Snapshot::wrapVector
                        ((Snapshot *)in_stack_fffffffffffffcf0,(Vector3d *)in_stack_fffffffffffffce8
                        );
            }
            uVar3 = *(uint *)(in_RDI + 0x231);
            pdVar6 = Vector<double,_3U>::operator[](local_b0,*(uint *)((long)in_RDI + 0x118c));
            dVar2 = *pdVar6;
            pdVar6 = RectMatrix<double,_3U,_3U>::operator()
                               (&local_108,*(uint *)((long)in_RDI + 0x118c),
                                *(uint *)((long)in_RDI + 0x118c));
            iVar5 = (int)(((double)uVar3 * (dVar1 * 0.5 + dVar2)) / *pdVar6);
            local_c0 = iVar5;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)(in_RDI + 0x22e),(long)local_c);
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)local_b8);
            *pvVar8 = iVar5;
          }
          local_50 = (HBondJump *)
                     Molecule::nextHBondAcceptor
                               ((Molecule *)
                                CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                                (iterator *)in_stack_fffffffffffffc88);
        }
        local_20 = SimInfo::nextMolecule
                             ((SimInfo *)
                              CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                              (MoleculeIterator *)in_stack_fffffffffffffc88);
      }
      local_40 = Molecule::nextHBondDonor
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                            (iterator *)in_stack_fffffffffffffc88);
    }
    in_stack_fffffffffffffcf0 =
         (HBondJump *)
         Molecule::beginHBondAcceptor
                   ((Molecule *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                    (iterator *)in_stack_fffffffffffffc88);
    local_50 = in_stack_fffffffffffffcf0;
    while (local_50 != (HBondJump *)0x0) {
      StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffffc78);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffc70,
                 (Vector3<double> *)in_stack_fffffffffffffc68);
      local_30._M_node = local_28._M_node;
      in_stack_fffffffffffffce8 =
           SimInfo::beginMolecule
                     ((SimInfo *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                      (MoleculeIterator *)in_stack_fffffffffffffc88);
      local_20 = in_stack_fffffffffffffce8;
      while (local_20 != (Molecule *)0x0) {
        local_40 = Molecule::beginHBondDonor
                             ((Molecule *)
                              CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                              (iterator *)in_stack_fffffffffffffc88);
        while (local_40 != (HBondDonor *)0x0) {
          local_b4 = StuntDouble::getGlobalIndex(&local_40->donatedHydrogen->super_StuntDouble);
          pvVar7 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0x1c8),(long)local_c);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)local_b4);
          local_b8 = *pvVar8;
          StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffffc78);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffc70,
                     (Vector3<double> *)in_stack_fffffffffffffc68);
          StuntDouble::getPos((StuntDouble *)in_stack_fffffffffffffc78);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffc70,
                     (Vector3<double> *)in_stack_fffffffffffffc68);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffc70,
                     (Vector3<double> *)in_stack_fffffffffffffc68);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffc70,
                     (Vector3<double> *)in_stack_fffffffffffffc68);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffc70,
                     (Vector3<double> *)in_stack_fffffffffffffc68);
          bVar4 = HBondJump::isHBond(in_stack_fffffffffffffd58,
                                     (Vector3d *)
                                     CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                                     (Vector3d *)in_stack_fffffffffffffd48,
                                     (Vector3d *)
                                     CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
          if (bVar4) {
            local_bc = StuntDouble::getGlobalIndex((StuntDouble *)local_50);
            HBondJump::registerHydrogenBond
                      (in_stack_fffffffffffffca0,(int)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                       SUB84(in_stack_fffffffffffffc98,0),in_stack_fffffffffffffc94,
                       in_stack_fffffffffffffc90);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffffc70,
                       (Vector3<double> *)in_stack_fffffffffffffc68);
            SimInfo::getSimParams((SimInfo *)in_RDI[0x13]);
            bVar4 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x15ac73);
            if (bVar4) {
              Snapshot::wrapVector
                        ((Snapshot *)in_stack_fffffffffffffcf0,(Vector3d *)in_stack_fffffffffffffce8
                        );
            }
            uVar3 = *(uint *)(in_RDI + 0x231);
            pdVar6 = Vector<double,_3U>::operator[](local_b0,*(uint *)((long)in_RDI + 0x118c));
            in_stack_fffffffffffffc98 = (double)uVar3 * (dVar1 * 0.5 + *pdVar6);
            in_stack_fffffffffffffca0 =
                 (HBondJump *)
                 RectMatrix<double,_3U,_3U>::operator()
                           (&local_108,*(uint *)((long)in_RDI + 0x118c),
                            *(uint *)((long)in_RDI + 0x118c));
            in_stack_fffffffffffffc94 =
                 (int)(in_stack_fffffffffffffc98 /
                      (double)(in_stack_fffffffffffffca0->super_TimeCorrFunc<double>).
                              super_DynamicProperty._vptr_DynamicProperty);
            local_c0 = in_stack_fffffffffffffc94;
            pvVar7 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)(in_RDI + 0x22e),(long)local_c);
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)local_b8);
            *pvVar8 = in_stack_fffffffffffffc94;
          }
          in_stack_fffffffffffffc88 =
               Molecule::nextHBondDonor
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                          (iterator *)in_stack_fffffffffffffc88);
          local_40 = in_stack_fffffffffffffc88;
        }
        local_20 = SimInfo::nextMolecule
                             ((SimInfo *)
                              CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                              (MoleculeIterator *)in_stack_fffffffffffffc88);
      }
      in_stack_fffffffffffffc78 =
           (HBondJump *)
           Molecule::nextHBondAcceptor
                     ((Molecule *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                      (iterator *)in_stack_fffffffffffffc88);
      local_50 = in_stack_fffffffffffffc78;
    }
    in_stack_fffffffffffffc70 =
         SimInfo::nextMolecule
                   ((SimInfo *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                    (MoleculeIterator *)in_stack_fffffffffffffc88);
    local_18 = in_stack_fffffffffffffc70;
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x15ae5e);
  return;
}

Assistant:

void HBondJumpZ::findHBonds(int frame) {
    Molecule* mol1;
    Molecule* mol2;
    SimInfo::MoleculeIterator mi, mj;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos, hPos, aPos, pos;
    int hInd, index, aInd, zBin;

    Mat3x3d hmat       = currentSnapshot_->getHmat();
    RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

    // Register all the possible HBond donor hydrogens:
    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = registerHydrogen(frame, hInd);
      }
    }

    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = GIDtoH_[frame][hInd];

        dPos = hbd->donorAtom->getPos();
        hPos = hbd->donatedHydrogen->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
              pos = hPos;
              if (info_->getSimParams()->getUsePeriodicBoundaryConditions())
                currentSnapshot_->wrapVector(pos);
              zBin =
                  int(nZBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
              zbin_[frame][index] = zBin;
            }
          }
        }
      }

      for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
           hba = mol1->nextHBondAcceptor(hbai)) {
        aPos = hba->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol2->nextHBondDonor(hbdi)) {
            hInd = hbd->donatedHydrogen->getGlobalIndex();
            // no need to register, just look up the index:
            index = GIDtoH_[frame][hInd];

            dPos = hbd->donorAtom->getPos();
            hPos = hbd->donatedHydrogen->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
              pos = hPos;
              if (info_->getSimParams()->getUsePeriodicBoundaryConditions())
                currentSnapshot_->wrapVector(pos);
              zBin =
                  int(nZBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
              zbin_[frame][index] = zBin;
            }
          }
        }
      }
    }
  }